

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1f38a46::HighBDConvolveHorizRSTest::RunOne
          (HighBDConvolveHorizRSTest *this,bool ref)

{
  int h;
  int out_length;
  int x0_qn;
  TestImage<unsigned_short> *pTVar1;
  int32_t x_step_qn;
  pointer puVar2;
  long lVar3;
  undefined7 in_register_00000031;
  int dst_stride;
  uint16_t *dst;
  int src_stride;
  uint16_t *local_48;
  
  pTVar1 = (this->super_ConvolveHorizRSTestBase<unsigned_short>).image_;
  if ((int)CONCAT71(in_register_00000031,ref) == 0) {
    h = pTVar1->h_;
    dst_stride = pTVar1->dst_stride_;
    src_stride = pTVar1->src_stride_;
    puVar2 = (pTVar1->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (long)((h + 0x40) * src_stride) + (long)src_stride * 0x20;
    lVar3 = (long)((h + 0x40) * dst_stride);
  }
  else {
    src_stride = pTVar1->src_stride_;
    puVar2 = (pTVar1->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)src_stride * 0x20;
    h = pTVar1->h_;
    dst_stride = pTVar1->dst_stride_;
    lVar3 = 0;
  }
  local_48 = puVar2 + 0x20;
  dst = (pTVar1->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar3 + (long)(dst_stride << 5) + 0x20;
  out_length = pTVar1->w_dst_;
  x0_qn = pTVar1->x0_;
  x_step_qn = av1_get_upscale_convolve_step(pTVar1->w_src_,out_length);
  if (ref) {
    av1_highbd_convolve_horiz_rs_c
              (local_48,src_stride,dst,dst_stride,out_length,h,av1_resize_filter_normative[0],x0_qn,
               x_step_qn,(this->super_ConvolveHorizRSTestBase<unsigned_short>).bd_);
  }
  else {
    (*this->tst_fun_)(local_48,src_stride,dst,dst_stride,out_length,h,av1_resize_filter_normative[0]
                      ,x0_qn,x_step_qn,(this->super_ConvolveHorizRSTestBase<unsigned_short>).bd_);
  }
  return;
}

Assistant:

void RunOne(bool ref) override {
    const uint16_t *src = image_->GetSrcData(ref, false);
    uint16_t *dst = image_->GetDstData(ref, false);
    const int src_stride = image_->src_stride();
    const int dst_stride = image_->dst_stride();
    const int width_src = image_->src_width();
    const int width_dst = image_->dst_width();
    const int height = image_->height();
    const int x0_qn = image_->x0();

    const int32_t x_step_qn =
        av1_get_upscale_convolve_step(width_src, width_dst);

    if (ref) {
      av1_highbd_convolve_horiz_rs_c(
          src, src_stride, dst, dst_stride, width_dst, height,
          &av1_resize_filter_normative[0][0], x0_qn, x_step_qn, bd_);
    } else {
      tst_fun_(src, src_stride, dst, dst_stride, width_dst, height,
               &av1_resize_filter_normative[0][0], x0_qn, x_step_qn, bd_);
    }
  }